

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

int nn_surveyor_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t *buf;
  nn_surveyor *local_30;
  nn_surveyor *surveyor;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_30 = (nn_surveyor *)self;
  if (self == (nn_sockbase *)0x0) {
    local_30 = (nn_surveyor *)0x0;
  }
  local_30->surveyid = local_30->surveyid + 1;
  local_30->surveyid = local_30->surveyid | 0x80000000;
  sVar3 = nn_chunkref_size(&msg->sphdr);
  if (sVar3 == 0) {
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_init(&msg->sphdr,4);
    buf = (uint8_t *)nn_chunkref_data(&msg->sphdr);
    nn_putl(buf,local_30->surveyid);
    nn_msg_term(&local_30->tosend);
    nn_msg_mv(&local_30->tosend,msg);
    nn_msg_init(msg,0);
    iVar1 = nn_surveyor_inprogress(local_30);
    if (iVar1 == 0) {
      nn_fsm_action(&local_30->fsm,1);
      self_local._4_4_ = 0;
    }
    else {
      uVar2 = nn_xsurveyor_events((nn_sockbase *)local_30);
      if ((uVar2 & 2) == 0) {
        self_local._4_4_ = -0xb;
      }
      else {
        nn_fsm_action(&local_30->fsm,2);
        self_local._4_4_ = 0;
      }
    }
    return self_local._4_4_;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/surveyor.c"
          ,0xcd);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_surveyor_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    /*  Generate new survey ID. */
    ++surveyor->surveyid;
    surveyor->surveyid |= 0x80000000;

    /*  Tag the survey body with survey ID. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 4);
    nn_putl (nn_chunkref_data (&msg->sphdr), surveyor->surveyid);

    /*  Store the survey, so that it can be sent later on. */
    nn_msg_term (&surveyor->tosend);
    nn_msg_mv (&surveyor->tosend, msg);
    nn_msg_init (msg, 0);

    /*  Cancel any ongoing survey, if any. */
    if (nn_slow (nn_surveyor_inprogress (surveyor))) {

        /*  First check whether the survey can be sent at all. */
        if (!(nn_xsurveyor_events (&surveyor->xsurveyor.sockbase) &
              NN_SOCKBASE_EVENT_OUT))
            return -EAGAIN;

        /*  Cancel the current survey. */
        nn_fsm_action (&surveyor->fsm, NN_SURVEYOR_ACTION_CANCEL);

        return 0;
    }

    /*  Notify the state machine that the survey was started. */
    nn_fsm_action (&surveyor->fsm, NN_SURVEYOR_ACTION_START);

    return 0;
}